

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_xc_edf1.c
# Opt level: O3

void lb07_set_ext_params(xc_func_type *p,double *ext_params)

{
  double dVar1;
  double par;
  
  dVar1 = get_ext_param(p,ext_params,0);
  par = get_ext_param(p,ext_params,1);
  *p->mix_coef = dVar1;
  xc_func_set_ext_params_name(*p->func_aux,"_omega",par);
  set_ext_params_lc(p,ext_params);
  return;
}

Assistant:

static void
lb07_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double w, omega;

  assert(p != NULL);
  w     = get_ext_param(p, ext_params, 0);
  omega = get_ext_param(p, ext_params, 1);

  /* Short-range LDA */
  p->mix_coef[0] = w;
  xc_func_set_ext_params_name(p->func_aux[0], "_omega", omega);

  /* 100% long-range exchange */
  set_ext_params_lc(p, ext_params);
}